

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15PrivateEnums.cpp
# Opt level: O3

ENUM__image_format_hint_channels_enum
COLLADASaxFWL15::toEnum_ENUM__image_format_hint_channels_enum
          (ParserChar **buffer,ParserChar *bufferEnd,bool *failed,
          pair<unsigned_long,_COLLADASaxFWL15::ENUM__image_format_hint_channels_enum> *enumMap,
          _func_StringHash_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *baseConversionFunc)

{
  StringHash SVar1;
  long lVar2;
  
  SVar1 = (*baseConversionFunc)(buffer,bufferEnd,failed);
  lVar2 = 8;
  do {
    if (*(StringHash *)((long)enumMap + lVar2 + -8) == SVar1) {
      *failed = false;
      return *(ENUM__image_format_hint_channels_enum *)((long)&enumMap->first + lVar2);
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x68);
  *failed = true;
  return ENUM__image_format_hint_channels_enum__COUNT;
}

Assistant:

ENUM__image_format_hint_channels_enum toEnum_ENUM__image_format_hint_channels_enum (
    const ParserChar** buffer,
    const ParserChar* bufferEnd,
    bool& failed,
    const std::pair<StringHash, ENUM__image_format_hint_channels_enum>* enumMap,
    StringHash (*baseConversionFunc)( const ParserChar**, const ParserChar*, bool& )
)
{
    return Utils::toEnum<ENUM__image_format_hint_channels_enum, StringHash, ENUM__image_format_hint_channels_enum__COUNT>(buffer, bufferEnd, failed, enumMap, baseConversionFunc);
}